

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall tinyusdz::crate::CrateReader::ReadReference(CrateReader *this,Reference *d)

{
  bool bVar1;
  value_type *rhs;
  ostream *poVar2;
  char *pcVar3;
  PathIndex index;
  CustomDataType customData;
  string assetPath;
  ostringstream ss_e;
  optional<tinyusdz::Path> path;
  Index local_2fc;
  LayerOffset local_2f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  local_2e8;
  string local_2b8;
  optional<tinyusdz::Path> local_298;
  optional<tinyusdz::Path> local_100;
  
  if (d == (Reference *)0x0) {
    return false;
  }
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_local_buf[0] = '\0';
  bVar1 = ReadString(this,&local_2b8);
  if (bVar1) {
    local_2fc.value = 0xffffffff;
    bVar1 = ReadIndex(this,&local_2fc);
    if (bVar1) {
      GetPath(&local_298,this,local_2fc);
      nonstd::optional_lite::optional<tinyusdz::Path>::optional<tinyusdz::Path,_0>
                (&local_100,&local_298);
      nonstd::optional_lite::optional<tinyusdz::Path>::~optional(&local_298);
      if (local_100.has_value_ == false) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_298);
        poVar2 = ::std::operator<<((ostream *)&local_298,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[Crate]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReadReference");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x3f5);
        ::std::operator<<(poVar2," ");
        pcVar3 = "Invalid Path index in Reference ValueRep.";
LAB_0017d5f8:
        poVar2 = ::std::operator<<((ostream *)&local_298,pcVar3);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)&this->_err);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_298);
        bVar1 = false;
      }
      else {
        local_2f8._offset._0_4_ = 0;
        local_2f8._offset._4_4_ = 0;
        local_2f8._scale._0_4_ = 0;
        local_2f8._scale._4_4_ = 0x3ff00000;
        bVar1 = ReadLayerOffset(this,&local_2f8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_298);
          poVar2 = ::std::operator<<((ostream *)&local_298,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,"[Crate]");
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ReadReference");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x3fa);
          ::std::operator<<(poVar2," ");
          pcVar3 = "Failed to read LayerOffset in Reference ValueRep.";
          goto LAB_0017d5f8;
        }
        local_2e8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_2e8._M_impl.super__Rb_tree_header._M_header;
        local_2e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_2e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_2e8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_2e8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_2e8._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar1 = ReadCustomData(this,(CustomDataType *)&local_2e8);
        if (bVar1) {
          tinyusdz::value::AssetPath::AssetPath((AssetPath *)&local_298,&local_2b8);
          tinyusdz::value::AssetPath::operator=(&d->asset_path,(AssetPath *)&local_298);
          tinyusdz::value::AssetPath::~AssetPath((AssetPath *)&local_298);
          rhs = nonstd::optional_lite::optional<tinyusdz::Path>::value(&local_100);
          Path::operator=(&d->prim_path,rhs);
          (d->layerOffset)._offset =
               (double)CONCAT44(local_2f8._offset._4_4_,local_2f8._offset._0_4_);
          (d->layerOffset)._scale = (double)CONCAT44(local_2f8._scale._4_4_,local_2f8._scale._0_4_);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
          ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                       *)&d->customData,
                      (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                       *)&local_2e8);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_298);
          poVar2 = ::std::operator<<((ostream *)&local_298,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,"[Crate]");
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ReadReference");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x3ff);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)&local_298,
                                     "Failed to read CustomData(Dict) in Reference ValueRep.");
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::append((string *)&this->_err);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_298);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
        ::~_Rb_tree(&local_2e8);
      }
      nonstd::optional_lite::optional<tinyusdz::Path>::~optional(&local_100);
      goto LAB_0017d739;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_298);
    poVar2 = ::std::operator<<((ostream *)&local_298,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,"[Crate]");
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadReference");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x3f0);
    ::std::operator<<(poVar2," ");
    pcVar3 = "Failed to read primPath Index in Reference ValueRep.";
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_298);
    poVar2 = ::std::operator<<((ostream *)&local_298,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,"[Crate]");
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadReference");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x3eb);
    ::std::operator<<(poVar2," ");
    pcVar3 = "Failed to read assetPath in Reference ValueRep.";
  }
  poVar2 = ::std::operator<<((ostream *)&local_298,pcVar3);
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::append((string *)&this->_err);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_298);
  bVar1 = false;
LAB_0017d739:
  ::std::__cxx11::string::_M_dispose();
  return bVar1;
}

Assistant:

bool CrateReader::ReadReference(Reference *d) {

  if (!d) {
    return false;
  }

  // assetPath : string
  // primPath : Path
  // layerOffset : LayerOffset
  // customData : Dict

  std::string assetPath;
  if (!ReadString(&assetPath)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read assetPath in Reference ValueRep.");
  }

  crate::PathIndex index;
  if (!ReadIndex(&index)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read primPath Index in Reference ValueRep.");
  }

  auto path = GetPath(index);
  if (!path) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Path index in Reference ValueRep.");
  }

  LayerOffset layerOffset;
  if (!ReadLayerOffset(&layerOffset)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read LayerOffset in Reference ValueRep.");
  }

  CustomDataType customData;
  if (!ReadCustomData(&customData)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read CustomData(Dict) in Reference ValueRep.");
  }

  d->asset_path = assetPath;
  d->prim_path = path.value();
  d->layerOffset = layerOffset;
  d->customData = customData;

  return true;
}